

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end_matcher.hpp
# Opt level: O3

bool boost::xpressive::detail::end_matcher::
     match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
               (match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *state,matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *param_2)

{
  char *pcVar1;
  sub_match_impl *psVar2;
  match_context<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar3;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar4;
  match_context<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar5;
  matchable<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar6;
  traits<char> *ptVar7;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar8;
  match_context<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pmVar9;
  traits<char> *ptVar10;
  int iVar11;
  char *pcVar12;
  bool bVar13;
  match_context<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *context;
  actionable *paVar14;
  match_context<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __tmp;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  pcVar1 = (state->cur_)._M_current;
  psVar2 = state->sub_matches_;
  pmVar3 = (state->context_).prev_context_;
  if (pmVar3 == (match_context<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x0) {
    if ((state->flags_).match_all_ == true) {
      if (pcVar1 != (state->end_)._M_current) goto LAB_0013b8ad;
      state->found_partial_match_ = true;
    }
    if ((state->flags_).match_not_null_ == false) {
      pcVar12 = (psVar2->begin_)._M_current;
    }
    else {
      pcVar12 = (psVar2->begin_)._M_current;
      if (pcVar1 == pcVar12) goto LAB_0013b8ad;
    }
    (psVar2->
    super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ).
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .first._M_current = pcVar12;
    (psVar2->
    super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ).
    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .second._M_current = pcVar1;
    (psVar2->
    super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ).matched = true;
    bVar13 = true;
    for (paVar14 = (state->action_list_).next; paVar14 != (actionable *)0x0; paVar14 = paVar14->next
        ) {
      (*paVar14->_vptr_actionable[2])(paVar14,state->action_args_);
    }
  }
  else {
    pmVar4 = (state->context_).results_ptr_;
    pmVar5 = (state->context_).prev_context_;
    pmVar6 = (state->context_).next_ptr_;
    ptVar7 = (state->context_).traits_;
    pmVar8 = pmVar3->results_ptr_;
    pmVar9 = pmVar3->prev_context_;
    ptVar10 = pmVar3->traits_;
    (state->context_).next_ptr_ = pmVar3->next_ptr_;
    (state->context_).traits_ = ptVar10;
    (state->context_).results_ptr_ = pmVar8;
    (state->context_).prev_context_ = pmVar9;
    local_48 = SUB84(pmVar4,0);
    uStack_44 = (undefined4)((ulong)pmVar4 >> 0x20);
    uStack_40 = SUB84(pmVar5,0);
    uStack_3c = (undefined4)((ulong)pmVar5 >> 0x20);
    local_38 = SUB84(pmVar6,0);
    uStack_34 = (undefined4)((ulong)pmVar6 >> 0x20);
    uStack_30 = SUB84(ptVar7,0);
    uStack_2c = (undefined4)((ulong)ptVar7 >> 0x20);
    *(undefined4 *)&pmVar3->next_ptr_ = local_38;
    *(undefined4 *)((long)&pmVar3->next_ptr_ + 4) = uStack_34;
    *(undefined4 *)&pmVar3->traits_ = uStack_30;
    *(undefined4 *)((long)&pmVar3->traits_ + 4) = uStack_2c;
    *(undefined4 *)&pmVar3->results_ptr_ = local_48;
    *(undefined4 *)((long)&pmVar3->results_ptr_ + 4) = uStack_44;
    *(undefined4 *)&pmVar3->prev_context_ = uStack_40;
    *(undefined4 *)((long)&pmVar3->prev_context_ + 4) = uStack_3c;
    pmVar4 = (state->context_).results_ptr_;
    state->sub_matches_ = (pmVar4->sub_matches_).sub_matches_;
    state->mark_count_ = (pmVar4->sub_matches_).size_;
    iVar11 = (*pmVar3->next_ptr_->_vptr_matchable[2])(pmVar3->next_ptr_,state);
    pmVar4 = (state->context_).results_ptr_;
    pmVar5 = (state->context_).prev_context_;
    pmVar6 = (state->context_).next_ptr_;
    ptVar7 = (state->context_).traits_;
    pmVar8 = pmVar3->results_ptr_;
    pmVar9 = pmVar3->prev_context_;
    ptVar10 = pmVar3->traits_;
    (state->context_).next_ptr_ = pmVar3->next_ptr_;
    (state->context_).traits_ = ptVar10;
    (state->context_).results_ptr_ = pmVar8;
    (state->context_).prev_context_ = pmVar9;
    pmVar3->next_ptr_ = pmVar6;
    pmVar3->traits_ = ptVar7;
    pmVar3->results_ptr_ = pmVar4;
    pmVar3->prev_context_ = pmVar5;
    pmVar4 = (state->context_).results_ptr_;
    state->sub_matches_ = (pmVar4->sub_matches_).sub_matches_;
    state->mark_count_ = (pmVar4->sub_matches_).size_;
    if ((char)iVar11 != '\0') {
      (psVar2->
      super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ).
      super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .first._M_current = (psVar2->begin_)._M_current;
      (psVar2->
      super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ).
      super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .second._M_current = pcVar1;
      (psVar2->
      super_sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ).matched = true;
      return true;
    }
LAB_0013b8ad:
    bVar13 = false;
  }
  return bVar13;
}

Assistant:

static bool match(match_state<BidiIter> &state, Next const &)
        {
            BidiIter const tmp = state.cur_;
            sub_match_impl<BidiIter> &s0 = state.sub_match(0);
            BOOST_ASSERT(!s0.matched);

            // SPECIAL: if there is a match context on the context stack, then
            // this pattern has been nested within another. pop that context and
            // continue executing.
            if(0 != state.context_.prev_context_)
            {
                if(!pop_context_match(state))
                {
                    return false;
                }

                // record the end of sub-match zero
                s0.first = s0.begin_;
                s0.second = tmp;
                s0.matched = true;

                return true;
            }
            else if((state.flags_.match_all_ && !state.eos()) ||
                    (state.flags_.match_not_null_ && state.cur_ == s0.begin_))
            {
                return false;
            }

            // record the end of sub-match zero
            s0.first = s0.begin_;
            s0.second = tmp;
            s0.matched = true;

            // Now execute any actions that have been queued
            for(actionable const *actor = state.action_list_.next; 0 != actor; actor = actor->next)
            {
                actor->execute(state.action_args_);
            }

            return true;
        }